

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.cpp
# Opt level: O0

void pzgeom::TPZQuadTorus::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  TPZVec<double> *result;
  TPZQuadTorus *pTVar4;
  TPZVec<double> *origin_00;
  long *plVar5;
  TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this;
  TPZVec<double> *in_RCX;
  TPZGeoMesh *in_RDI;
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *gel;
  TPZManVector<double,_2> loc;
  TPZManVector<double,_3> xco;
  int i;
  REAL coords [4] [2];
  TPZManVector<long,_4> indexes;
  TPZQuadTorus torus;
  TPZFNMatrix<12,_double> phitheta;
  TPZManVector<double,_3> origin;
  REAL r;
  REAL R;
  TPZFMatrix<double> *in_stack_fffffffffffffb08;
  TPZGeoMesh *in_stack_fffffffffffffb10;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffb18;
  TPZGeoNode *in_stack_fffffffffffffb20;
  int64_t in_stack_fffffffffffffb28;
  TPZQuadTorus *in_stack_fffffffffffffb30;
  TPZGeoMesh *in_stack_fffffffffffffb38;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffb40;
  TPZVec<double> *in_stack_fffffffffffffb48;
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *in_stack_fffffffffffffb50;
  TPZVec<double> *in_stack_fffffffffffffbf0;
  TPZFMatrix<double> *in_stack_fffffffffffffbf8;
  TPZQuadTorus *in_stack_fffffffffffffc00;
  int local_39c;
  double local_398 [8];
  TPZVec<long> local_358 [2];
  TPZQuadTorus local_318;
  undefined8 local_178;
  TPZVec<double> local_68;
  REAL local_30;
  REAL local_28;
  TPZVec<double> *local_20;
  TPZGeoMesh *local_8;
  
  local_28 = 1.0;
  local_30 = 0.8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  pdVar3 = TPZVec<double>::operator[](in_RCX,0);
  *pdVar3 = 2.0;
  pdVar3 = TPZVec<double>::operator[](local_20,1);
  *pdVar3 = 2.0;
  pdVar3 = TPZVec<double>::operator[](local_20,2);
  *pdVar3 = 1.0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  result = (TPZVec<double> *)TPZVec<double>::operator[](&local_68,0);
  result->_vptr_TPZVec = (_func_int **)((double)result->_vptr_TPZVec + 1.0);
  local_178 = 0;
  TPZFNMatrix<12,_double>::TPZFNMatrix
            ((TPZFNMatrix<12,_double> *)in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48
             ,(int64_t)in_stack_fffffffffffffb40,(double *)in_stack_fffffffffffffb38);
  pdVar3 = TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  *pdVar3 = 1.0471975511965976;
  pdVar3 = TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  *pdVar3 = 0.0;
  pTVar4 = (TPZQuadTorus *)
           TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  (pTVar4->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
  super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x3ff0c152382d7365;
  origin_00 = (TPZVec<double> *)
              TPZFMatrix<double>::operator()
                        ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                         (int64_t)in_stack_fffffffffffffb20);
  origin_00->_vptr_TPZVec = (_func_int **)0x400921fb54442d18;
  pdVar3 = TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                      (int64_t)in_stack_fffffffffffffb20);
  *pdVar3 = 3.141592653589793;
  TPZQuadTorus(in_stack_fffffffffffffb30);
  SetOrigin(pTVar4,origin_00);
  SetDataRadius(&local_318,&local_28,&local_30);
  SetDataPhiTheta((TPZQuadTorus *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  memcpy(local_398,&DAT_020916a0,0x40);
  for (local_39c = 0; iVar2 = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20), local_39c < 4;
      local_39c = local_39c + 1) {
    TPZGeoMesh::NodeVec(local_8);
    iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffb18);
    plVar5 = TPZVec<long>::operator[](local_358,(long)local_39c);
    *plVar5 = (long)iVar2;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    TPZManVector<double,_2>::TPZManVector
              ((TPZManVector<double,_2> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    dVar1 = local_398[(long)local_39c * 2];
    pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xfffffffffffffbf8,0);
    *pdVar3 = dVar1;
    in_stack_fffffffffffffb48 = (TPZVec<double> *)local_398[(long)local_39c * 2 + 1];
    in_stack_fffffffffffffb50 =
         (TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *)
         TPZVec<double>::operator[]((TPZVec<double> *)&stack0xfffffffffffffbf8,1);
    *(TPZVec<double> **)
     &(in_stack_fffffffffffffb50->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).super_TPZGeoEl =
         in_stack_fffffffffffffb48;
    X<double>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,result);
    in_stack_fffffffffffffb40 = TPZGeoMesh::NodeVec(local_8);
    in_stack_fffffffffffffb38 = (TPZGeoMesh *)TPZVec<long>::operator[](local_358,(long)local_39c);
    in_stack_fffffffffffffb30 =
         (TPZQuadTorus *)
         TPZChunkVector<TPZGeoNode,_10>::operator[]
                   ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffb30,
                    in_stack_fffffffffffffb28);
    TPZGeoNode::Initialize
              (in_stack_fffffffffffffb20,(TPZVec<double> *)in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)in_stack_fffffffffffffb10);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffb10);
  }
  this = (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *)operator_new(0x2e0);
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern
            (in_stack_fffffffffffffb50,(TPZVec<long> *)in_stack_fffffffffffffb48,iVar2,
             in_stack_fffffffffffffb38);
  TPZGeoElRefLess<pzgeom::TPZQuadTorus>::Geom(this);
  SetOrigin(pTVar4,origin_00);
  pTVar4 = TPZGeoElRefLess<pzgeom::TPZQuadTorus>::Geom(this);
  SetDataRadius(pTVar4,&local_28,&local_30);
  pTVar4 = TPZGeoElRefLess<pzgeom::TPZQuadTorus>::Geom(this);
  SetDataPhiTheta(pTVar4,in_stack_fffffffffffffb08);
  TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)pTVar4);
  ~TPZQuadTorus((TPZQuadTorus *)0x1712069);
  TPZFNMatrix<12,_double>::~TPZFNMatrix((TPZFNMatrix<12,_double> *)0x1712076);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)pTVar4);
  return;
}

Assistant:

void pzgeom::TPZQuadTorus::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        REAL R = 1., r = 0.8;
        size[0] = 2.;
        size[1] = 2.;
        size[2] = 1.;
        TPZManVector<REAL,3> origin(lowercorner);
        origin[0] += 1.;        
        TPZFNMatrix<12,REAL> phitheta(2,4,0.);
        phitheta(0,0) = 0.;
        phitheta(1,0) = 0;
        
        phitheta(0,1) = M_PI/3;
        phitheta(1,1) = 0;
        
        phitheta(0,2) = M_PI/3;
        phitheta(1,2) = M_PI;
        
        phitheta(0,3) = 0.;
        phitheta(1,3) = M_PI;

        TPZQuadTorus torus;
        torus.SetOrigin(origin);
        torus.SetDataRadius(R, r);
        torus.SetDataPhiTheta(phitheta);
        TPZManVector<int64_t,4> indexes(4);
        constexpr REAL coords[4][2] = {
            {-1,-1},{1,-1},{1,1},{-1,1}
        };
        for (int i=0; i<4; i++) {
            indexes[i] = gmesh.NodeVec().AllocateNewElement();
            TPZManVector<REAL,3> xco(3);
            TPZManVector<REAL, 2>loc(2);
            loc[0] = coords[i][0];
            loc[1] = coords[i][1];
            torus.X(phitheta, loc, xco);
            gmesh.NodeVec()[indexes[i]].Initialize(xco, gmesh);
        }
        TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *gel = new TPZGeoElRefPattern<pzgeom::TPZQuadTorus>(indexes,matid,gmesh);
        gel->Geom().SetOrigin(origin);
        gel->Geom().SetDataRadius(R, r);
        gel->Geom().SetDataPhiTheta(phitheta);
    }